

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::generateLogon(Session *this,Message *aLogon)

{
  bool bVar1;
  Message *__p;
  type this_00;
  FieldMap *this_01;
  Header *header;
  allocator<char> local_2d1;
  STRING local_2d0;
  FieldBase local_2b0;
  BOOLEAN local_249;
  FieldBase local_248;
  FieldBase local_1e8;
  INT local_184;
  FieldBase local_180;
  undefined1 local_120 [8];
  HeartBtInt heartBtInt;
  EncryptMethod encryptMethod;
  Message *logon;
  allocator<char> local_41;
  string local_40;
  unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> local_20;
  unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_> pMsg;
  Message *aLogon_local;
  Session *this_local;
  
  pMsg._M_t.super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>._M_t.
  super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
  super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl =
       (__uniq_ptr_data<FIX::Message,_std::default_delete<FIX::Message>,_true,_true>)
       (__uniq_ptr_data<FIX::Message,_std::default_delete<FIX::Message>,_true,_true>)aLogon;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"A",&local_41);
  __p = newMessage(this,&local_40);
  std::unique_ptr<FIX::Message,std::default_delete<FIX::Message>>::
  unique_ptr<std::default_delete<FIX::Message>,void>
            ((unique_ptr<FIX::Message,std::default_delete<FIX::Message>> *)&local_20,__p);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::operator*(&local_20);
  EncryptMethod::EncryptMethod
            ((EncryptMethod *)&heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum);
  HeartBtInt::HeartBtInt((HeartBtInt *)local_120);
  local_184 = 0;
  EncryptMethod::EncryptMethod((EncryptMethod *)&local_180,&local_184);
  FieldMap::setField(&this_00->super_FieldMap,&local_180,true);
  EncryptMethod::~EncryptMethod((EncryptMethod *)&local_180);
  bVar1 = SessionID::isFIXT(&this->m_sessionID);
  if (bVar1) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_1e8,&this->m_senderDefaultApplVerID);
    FieldMap::setField(&this_00->super_FieldMap,&local_1e8,true);
    DefaultApplVerID::~DefaultApplVerID((DefaultApplVerID *)&local_1e8);
  }
  bVar1 = SessionState::receivedReset(&this->m_state);
  if (bVar1) {
    local_249 = true;
    ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)&local_248,&local_249);
    FieldMap::setField(&this_00->super_FieldMap,&local_248,true);
    ResetSeqNumFlag::~ResetSeqNumFlag((ResetSeqNumFlag *)&local_248);
  }
  FieldMap::getField((FieldMap *)
                     pMsg._M_t.
                     super___uniq_ptr_impl<FIX::Message,_std::default_delete<FIX::Message>_>._M_t.
                     super__Tuple_impl<0UL,_FIX::Message_*,_std::default_delete<FIX::Message>_>.
                     super__Head_base<0UL,_FIX::Message_*,_false>._M_head_impl,
                     (FieldBase *)local_120);
  this_01 = &Message::getHeader(this_00)->super_FieldMap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"A",&local_2d1);
  MsgType::MsgType((MsgType *)&local_2b0,&local_2d0);
  FieldMap::setField(this_01,&local_2b0,true);
  MsgType::~MsgType((MsgType *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  FieldMap::setField(&this_00->super_FieldMap,(FieldBase *)local_120,true);
  header = Message::getHeader(this_00);
  fill(this,header);
  sendRaw(this,this_00,0);
  SessionState::sentLogon(&this->m_state,true);
  HeartBtInt::~HeartBtInt((HeartBtInt *)local_120);
  EncryptMethod::~EncryptMethod
            ((EncryptMethod *)&heartBtInt.super_IntField.super_FieldBase.m_metrics.m_checksum);
  std::unique_ptr<FIX::Message,_std::default_delete<FIX::Message>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void Session::generateLogon( const Message& aLogon )
{
  SmartPtr<Message> pMsg(newMessage("A"));
  Message & logon = *pMsg;

  EncryptMethod encryptMethod;
  HeartBtInt heartBtInt;
  logon.setField( EncryptMethod( 0 ) );
  if( m_sessionID.isFIXT() )
    logon.setField( DefaultApplVerID(m_senderDefaultApplVerID) );  
  if( m_state.receivedReset() )
    logon.setField( ResetSeqNumFlag(true) );
  aLogon.getField( heartBtInt );
  logon.getHeader().setField( MsgType( "A" ) );
  logon.setField( heartBtInt );
  fill( logon.getHeader() );
  sendRaw( logon );
  m_state.sentLogon( true );
}